

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeToggledCase::render(DecodeToggledCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  deUint32 dVar6;
  deBool dVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  ObjectWrapper *this_00;
  size_type sVar10;
  reference ppSVar11;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
  *pvVar12;
  reference ppSVar13;
  undefined8 uVar14;
  TestError *this_01;
  reference ppSVar15;
  ulong local_40;
  size_t textureSourceIdx_1;
  int samplerIdx;
  int local_24;
  GLuint samplerUniformLocationID;
  int textureSourceIdx;
  size_t programIdx;
  Functions *gl;
  DecodeToggledCase *this_local;
  long lVar9;
  
  pRVar8 = gles31::Context::getRenderContext((this->super_SRGBTestCase).super_TestCase.m_context);
  iVar3 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  pcVar1 = *(code **)(lVar9 + 0x78);
  this_00 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             ::operator*(&(this->super_SRGBTestCase).m_framebuffer.
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        )->super_ObjectWrapper;
  dVar4 = glu::ObjectWrapper::operator*(this_00);
  (*pcVar1)(0x8d40,dVar4);
  (**(code **)(lVar9 + 0xd8))((this->super_SRGBTestCase).m_vaoID);
  _samplerUniformLocationID = 0;
  do {
    sVar10 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
             ::size(&(this->super_SRGBTestCase).m_shaderProgramList);
    if (sVar10 <= _samplerUniformLocationID) {
      local_40 = 0;
      while( true ) {
        sVar10 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                 ::size(&(this->super_SRGBTestCase).m_textureSourceList);
        if (sVar10 <= local_40) break;
        pcVar1 = *(code **)(lVar9 + 0xb8);
        ppSVar13 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                   ::operator[](&(this->super_SRGBTestCase).m_textureSourceList,local_40);
        dVar4 = SRGBTestTexture::getGLTargetType(*ppSVar13);
        (*pcVar1)(dVar4);
        local_40 = local_40 + 1;
      }
      (**(code **)(lVar9 + 0x78))(0x8d40,0);
      (**(code **)(lVar9 + 0xd8))(0);
      (**(code **)(lVar9 + 0x40))(0x8892,0);
      return;
    }
    pcVar1 = *(code **)(lVar9 + 0x1680);
    ppSVar11 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
               ::operator[](&(this->super_SRGBTestCase).m_shaderProgramList,
                            _samplerUniformLocationID);
    GVar5 = SRGBTestProgram::getHandle(*ppSVar11);
    (*pcVar1)(GVar5);
    ppSVar11 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
               ::operator[](&(this->super_SRGBTestCase).m_shaderProgramList,
                            _samplerUniformLocationID);
    pvVar12 = SRGBTestProgram::getUniformDataList(*ppSVar11);
    SRGBTestCase::toggleDecode(&this->super_SRGBTestCase,pvVar12);
    local_24 = 0;
    while( true ) {
      sVar10 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
               ::size(&(this->super_SRGBTestCase).m_textureSourceList);
      if ((int)sVar10 <= local_24) break;
      (**(code **)(lVar9 + 8))(local_24 + 0x84c0);
      pcVar1 = *(code **)(lVar9 + 0xb8);
      ppSVar13 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                 ::operator[](&(this->super_SRGBTestCase).m_textureSourceList,(long)local_24);
      dVar4 = SRGBTestTexture::getGLTargetType(*ppSVar13);
      ppSVar13 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                 ::operator[](&(this->super_SRGBTestCase).m_textureSourceList,(long)local_24);
      dVar6 = SRGBTestTexture::getHandle(*ppSVar13);
      (*pcVar1)(dVar4,dVar6);
      pcVar1 = *(code **)(lVar9 + 0xb48);
      ppSVar11 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                 ::operator[](&(this->super_SRGBTestCase).m_shaderProgramList,
                              _samplerUniformLocationID);
      GVar5 = SRGBTestProgram::getHandle(*ppSVar11);
      ppSVar11 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
                 ::operator[](&(this->super_SRGBTestCase).m_shaderProgramList,
                              _samplerUniformLocationID);
      SRGBTestProgram::getUniformAtLocation(*ppSVar11,local_24);
      uVar14 = std::__cxx11::string::c_str();
      iVar3 = (*pcVar1)(GVar5,uVar14);
      do {
        dVar7 = ::deGetFalse();
        if ((dVar7 != 0) || (iVar3 == -1)) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,(char *)0x0,"samplerUniformLocationID != (glw::GLuint) - 1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                     ,0x6d2);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar7 = ::deGetFalse();
      } while (dVar7 != 0);
      (**(code **)(lVar9 + 0x14f0))(iVar3,local_24);
      local_24 = local_24 + 1;
    }
    textureSourceIdx_1._0_4_ = 0;
    while( true ) {
      sVar10 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
               ::size(&(this->super_SRGBTestCase).m_samplerList);
      if ((int)sVar10 <= (int)textureSourceIdx_1) break;
      ppSVar15 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                 ::operator[](&(this->super_SRGBTestCase).m_samplerList,
                              (long)(int)textureSourceIdx_1);
      bVar2 = SRGBTestSampler::getIsActive(*ppSVar15);
      if (bVar2) {
        ppSVar15 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                   ::operator[](&(this->super_SRGBTestCase).m_samplerList,
                                (long)(int)textureSourceIdx_1);
        SRGBTestSampler::bindToTexture(*ppSVar15);
      }
      textureSourceIdx_1._0_4_ = (int)textureSourceIdx_1 + 1;
    }
    ppSVar11 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
               ::operator[](&(this->super_SRGBTestCase).m_shaderProgramList,
                            _samplerUniformLocationID);
    bVar2 = SRGBTestProgram::getBlendRequired(*ppSVar11);
    if (bVar2) {
      (**(code **)(lVar9 + 0x5e0))(0xbe2);
      (**(code **)(lVar9 + 0x100))(0x8008);
      (**(code **)(lVar9 + 0x120))(1);
    }
    else {
      (**(code **)(lVar9 + 0x4e8))(0xbe2);
    }
    (**(code **)(lVar9 + 0x538))(4,0,6);
    ppSVar11 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
               ::operator[](&(this->super_SRGBTestCase).m_shaderProgramList,
                            _samplerUniformLocationID);
    pvVar12 = SRGBTestProgram::getUniformDataList(*ppSVar11);
    SRGBTestCase::toggleDecode(&this->super_SRGBTestCase,pvVar12);
    _samplerUniformLocationID = _samplerUniformLocationID + 1;
  } while( true );
}

Assistant:

void DecodeToggledCase::render (void)
{
	// override the base SRGBTestCase render function with the purpose of switching between shader programs,
	// toggling texture sRGB decode state between draw calls
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_framebuffer);
	gl.bindVertexArray(m_vaoID);

	for (std::size_t programIdx = 0; programIdx < m_shaderProgramList.size(); programIdx++)
	{
		gl.useProgram(m_shaderProgramList[programIdx]->getHandle());

		this->toggleDecode(m_shaderProgramList[programIdx]->getUniformDataList());

		for (int textureSourceIdx = 0; textureSourceIdx < (int)m_textureSourceList.size(); textureSourceIdx++)
		{
			gl.activeTexture(GL_TEXTURE0 + (glw::GLenum)textureSourceIdx);
			gl.bindTexture(m_textureSourceList[textureSourceIdx]->getGLTargetType(), m_textureSourceList[textureSourceIdx]->getHandle());
			glw::GLuint samplerUniformLocationID = gl.getUniformLocation(m_shaderProgramList[programIdx]->getHandle(), m_shaderProgramList[programIdx]->getUniformAtLocation(textureSourceIdx).name.c_str());
			TCU_CHECK(samplerUniformLocationID != (glw::GLuint) - 1);
			gl.uniform1i(samplerUniformLocationID, (glw::GLenum)textureSourceIdx);
		}

		for (int samplerIdx = 0; samplerIdx < (int)m_samplerList.size(); samplerIdx++)
		{
			if (m_samplerList[samplerIdx]->getIsActive() == true)
			{
				m_samplerList[samplerIdx]->bindToTexture();
			}
		}

		if (m_shaderProgramList[programIdx]->getBlendRequired() == true)
		{
			gl.enable(GL_BLEND);
			gl.blendEquation(GL_MAX);
			gl.blendFunc(GL_ONE, GL_ONE);
		}
		else
		{
			gl.disable(GL_BLEND);
		}

		gl.drawArrays(GL_TRIANGLES, 0, 6);

		// reset sRGB decode state on textures
		this->toggleDecode(m_shaderProgramList[programIdx]->getUniformDataList());
	}

	for (std::size_t textureSourceIdx = 0; textureSourceIdx < m_textureSourceList.size(); textureSourceIdx++)
	{
		gl.bindTexture(m_textureSourceList[textureSourceIdx]->getGLTargetType(), 0);
	}
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
}